

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

bool __thiscall QListModel::insertRows(QListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QListWidget *pQVar3;
  QListWidgetItem *this_00;
  ulong i;
  long in_FS_OFFSET;
  QListWidgetItem *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    local_50 = (QListWidgetItem *)0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    iVar2 = (**(code **)(*(long *)this + 0x78))();
    if ((row <= iVar2) &&
       (((parent->r < 0 || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)))) {
      local_50 = (QListWidgetItem *)0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_50,row);
      pQVar3 = (QListWidget *)QMetaObject::cast((QObject *)&QListWidget::staticMetaObject);
      i = (ulong)(uint)row;
      do {
        this_00 = (QListWidgetItem *)operator_new(0x28);
        QListWidgetItem::QListWidgetItem(this_00,(QListWidget *)0x0,0);
        this_00->view = pQVar3;
        this_00->d->theid = (int)i;
        local_50 = this_00;
        QtPrivate::QPodArrayOps<QListWidgetItem*>::emplace<QListWidgetItem*&>
                  ((QPodArrayOps<QListWidgetItem*> *)&this->items,i,&local_50);
        QList<QListWidgetItem_*>::begin(&this->items);
        i = i + 1;
      } while ((int)i < count + row);
      QAbstractItemModel::endInsertRows();
      bVar1 = true;
      goto LAB_0057a9ab;
    }
  }
  bVar1 = false;
LAB_0057a9ab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::insertRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || row > rowCount() || parent.isValid())
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);
    QListWidget *view = this->view();
    QListWidgetItem *itm = nullptr;

    for (int r = row; r < row + count; ++r) {
        itm = new QListWidgetItem;
        itm->view = view;
        itm->d->theid = r;
        items.insert(r, itm);
    }

    endInsertRows();
    return true;
}